

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

ImU32 ImGui::TabBarCalcTabID(ImGuiTabBar *tab_bar,char *label)

{
  ImGuiWindow *window;
  ImGuiID id;
  char *label_local;
  ImGuiTabBar *tab_bar_local;
  
  if ((tab_bar->Flags & 0x100000U) == 0) {
    tab_bar_local._4_4_ = ImGuiWindow::GetID(GImGui->CurrentWindow,label,(char *)0x0);
  }
  else {
    tab_bar_local._4_4_ = ImHashStr(label,0,0);
    KeepAliveID(tab_bar_local._4_4_);
  }
  return tab_bar_local._4_4_;
}

Assistant:

static ImU32   ImGui::TabBarCalcTabID(ImGuiTabBar* tab_bar, const char* label)
{
    if (tab_bar->Flags & ImGuiTabBarFlags_DockNode)
    {
        ImGuiID id = ImHashStr(label);
        KeepAliveID(id);
        return id;
    }
    else
    {
        ImGuiWindow* window = GImGui->CurrentWindow;
        return window->GetID(label);
    }
}